

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O2

void __thiscall
blcl::net::server_interface<MsgType>::broadcast_message
          (server_interface<MsgType> *this,message<MsgType> *msg,
          shared_ptr<blcl::net::connection<MsgType>_> *ignored_client)

{
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  connection<MsgType> *this_00;
  size_t in_RCX;
  shared_ptr<blcl::net::connection<MsgType>_> *extraout_RDX;
  shared_ptr<blcl::net::connection<MsgType>_> *extraout_RDX_00;
  shared_ptr<blcl::net::connection<MsgType>_> *__buf;
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *this_01;
  int in_R8D;
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  _Map_pointer local_130;
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> local_110;
  void *local_100;
  const_iterator local_f8;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_d8;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_b8;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_98;
  const_iterator local_78;
  iterator local_50;
  
  this_01 = &((this->connections_).
              super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((this->connections_).
             super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last)->
            super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>;
  local_130 = (this->connections_).
              super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  p_Var1 = &((this->connections_).
             super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
            super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>;
  bVar3 = false;
  __buf = ignored_client;
  while (this_01 != p_Var1) {
    this_00 = this_01->_M_ptr;
    if ((this_00 == (connection<MsgType> *)0x0) ||
       ((this_00->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
        implementation_.super_base_implementation_type.socket_ == -1)) {
      std::__shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_110,this_01);
      (*this->_vptr_server_interface[3])(this,&local_110);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
      std::__shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>::reset(this_01);
      bVar3 = true;
      __buf = extraout_RDX_00;
    }
    else if ((this_00 !=
              (ignored_client->
              super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ) && (this_00->validated_ == true)) {
      connection<MsgType>::send(this_00,(int)msg,__buf,in_RCX,in_R8D);
      __buf = extraout_RDX;
    }
    this_01 = this_01 + 1;
    if (this_01 == p_Var2) {
      this_01 = &local_130[1]->
                 super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>;
      local_130 = local_130 + 1;
      p_Var2 = this_01 + 0x20;
    }
  }
  if (bVar3) {
    local_b8._M_cur =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_b8._M_first =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_b8._M_last =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_b8._M_node =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_d8._M_cur =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_d8._M_first =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_d8._M_last =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_d8._M_node =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_100 = (void *)0x0;
    std::
    remove<std::_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>&,std::shared_ptr<blcl::net::connection<MsgType>>*>,decltype(nullptr)>
              (&local_98,&local_b8,&local_d8,&local_100);
    local_78._M_cur = local_98._M_cur;
    local_78._M_first = local_98._M_first;
    local_78._M_last = local_98._M_last;
    local_78._M_node = local_98._M_node;
    local_f8._M_cur =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_f8._M_first =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_f8._M_last =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_f8._M_node =
         (this->connections_).
         super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
    ::erase(&local_50,&this->connections_,&local_78,&local_f8);
  }
  return;
}

Assistant:

void broadcast_message(const message<T>& msg, std::shared_ptr<connection<T>> ignored_client = nullptr) {
            bool invalid_client_exists = false;

            for (auto& client: connections_) {
                if (client && client->is_connected()) {
                    if (client != ignored_client && client->is_validated())
                        client->send(msg);
                } else {
                    on_client_disconnect(client);
                    client.reset();
                    invalid_client_exists = true;
                }
            }

            if (invalid_client_exists)
                connections_.erase(
                        std::remove(connections_.begin(), connections_.end(), nullptr), connections_.end());
        }